

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O2

objc_protocol_method_description *
get_method_description(Protocol *p,SEL aSel,BOOL isRequiredMethod,BOOL isInstanceMethod)

{
  BOOL BVar1;
  objc_protocol_method_description_list *l;
  objc_protocol_method_description *poVar2;
  int i;
  
  l = get_method_list(p,isRequiredMethod,isInstanceMethod);
  if (l != (objc_protocol_method_description_list *)0x0) {
    for (i = 0; i < l->count; i = i + 1) {
      poVar2 = protocol_method_at_index(l,i);
      BVar1 = sel_isEqual(poVar2->selector,aSel);
      if (BVar1 != '\0') {
        poVar2 = protocol_method_at_index(l,i);
        return poVar2;
      }
    }
  }
  return (objc_protocol_method_description *)0x0;
}

Assistant:

static struct objc_protocol_method_description *
get_method_description(Protocol *p,
                       SEL aSel,
                       BOOL isRequiredMethod,
                       BOOL isInstanceMethod)
{
	struct objc_protocol_method_description_list *list =
		get_method_list(p, isRequiredMethod, isInstanceMethod);
	if (NULL == list)
	{
		return NULL;
	}
	for (int i=0 ; i<list->count ; i++)
	{
		SEL s = protocol_method_at_index(list, i)->selector;
		if (sel_isEqual(s, aSel))
		{
			return protocol_method_at_index(list, i);
		}
	}
	return NULL;
}